

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O0

bool __thiscall
draco::RAnsSymbolDecoder<16>::Create(RAnsSymbolDecoder<16> *this,DecoderBuffer *buffer)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  int64_t iVar4;
  reference pvVar5;
  DecoderBuffer *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint8_t eb;
  int b;
  uint32_t prob;
  int extra_bytes;
  uint32_t j;
  uint32_t offset;
  int token;
  uint8_t prob_data;
  uint32_t i;
  uint *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint local_1c;
  bool local_1;
  
  uVar2 = DecoderBuffer::bitstream_version(in_RSI);
  if (uVar2 == 0) {
    local_1 = false;
  }
  else {
    uVar2 = DecoderBuffer::bitstream_version(in_RSI);
    if (uVar2 < 0x200) {
      bVar1 = DecoderBuffer::Decode<unsigned_int>
                        ((DecoderBuffer *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0);
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = DecodeVarint<unsigned_int>(in_stack_ffffffffffffff98,(DecoderBuffer *)0x25d96e);
      if (!bVar1) {
        return false;
      }
    }
    uVar3 = *(uint *)&in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    iVar4 = DecoderBuffer::remaining_size(in_RSI);
    if (iVar4 < (long)(ulong)(uVar3 >> 6)) {
      local_1 = false;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),(size_type)in_RDI);
      if (*(int *)&in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start == 0) {
        local_1 = true;
      }
      else {
        for (local_1c = 0;
            local_1c <
            *(uint *)&in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start; local_1c = local_1c + 1) {
          bVar1 = DecoderBuffer::Decode<unsigned_char>
                            ((DecoderBuffer *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (uchar *)in_stack_ffffffffffffffa0);
          if (!bVar1) {
            return false;
          }
          uVar3 = 0;
          for (in_stack_ffffffffffffffc8 = 0; in_stack_ffffffffffffffc8 < 0;
              in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
            bVar1 = DecoderBuffer::Decode<unsigned_char>
                              ((DecoderBuffer *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (uchar *)in_stack_ffffffffffffffa0);
            if (!bVar1) {
              return false;
            }
            uVar3 = (uint)in_stack_ffffffffffffffc7 <<
                    (((char)in_stack_ffffffffffffffc8 + '\x01') * '\b' - 2U & 0x1f) | uVar3;
          }
          in_stack_ffffffffffffffcc = uVar3;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (in_RDI,(ulong)local_1c);
          *pvVar5 = uVar3;
          in_stack_ffffffffffffffac = uVar3;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,0);
        bVar1 = RAnsDecoder<20>::rans_build_look_up_table
                          ((RAnsDecoder<20> *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (uint32_t *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
                           ,(uint32_t)((ulong)in_RDI >> 0x20));
        if (bVar1) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool RAnsSymbolDecoder<unique_symbols_bit_length_t>::Create(
    DecoderBuffer *buffer) {
  // Check that the DecoderBuffer version is set.
  if (buffer->bitstream_version() == 0) {
    return false;
  }
  // Decode the number of alphabet symbols.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!buffer->Decode(&num_symbols_)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_symbols_, buffer)) {
      return false;
    }
  }
  // Check that decoded number of symbols is not unreasonably high. Remaining
  // buffer size must be at least |num_symbols| / 64 bytes to contain the
  // probability table. The |prob_data| below is one byte but it can be
  // theoretically stored for each 64th symbol.
  if (num_symbols_ / 64 > buffer->remaining_size()) {
    return false;
  }
  probability_table_.resize(num_symbols_);
  if (num_symbols_ == 0) {
    return true;
  }
  // Decode the table.
  for (uint32_t i = 0; i < num_symbols_; ++i) {
    uint8_t prob_data = 0;
    // Decode the first byte and extract the number of extra bytes we need to
    // get, or the offset to the next symbol with non-zero probability.
    if (!buffer->Decode(&prob_data)) {
      return false;
    }
    // Token is stored in the first two bits of the first byte. Values 0-2 are
    // used to indicate the number of extra bytes, and value 3 is a special
    // symbol used to denote run-length coding of zero probability entries.
    // See rans_symbol_encoder.h for more details.
    const int token = prob_data & 3;
    if (token == 3) {
      const uint32_t offset = prob_data >> 2;
      if (i + offset >= num_symbols_) {
        return false;
      }
      // Set zero probability for all symbols in the specified range.
      for (uint32_t j = 0; j < offset + 1; ++j) {
        probability_table_[i + j] = 0;
      }
      i += offset;
    } else {
      const int extra_bytes = token;
      uint32_t prob = prob_data >> 2;
      for (int b = 0; b < extra_bytes; ++b) {
        uint8_t eb;
        if (!buffer->Decode(&eb)) {
          return false;
        }
        // Shift 8 bits for each extra byte and subtract 2 for the two first
        // bits.
        prob |= static_cast<uint32_t>(eb) << (8 * (b + 1) - 2);
      }
      probability_table_[i] = prob;
    }
  }
  if (!ans_.rans_build_look_up_table(&probability_table_[0], num_symbols_)) {
    return false;
  }
  return true;
}